

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

QSize __thiscall QWizard::sizeHint(QWizard *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QWizardPrivate *this_00;
  QSize QVar4;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QWizardPrivate *d;
  QSize pixmap;
  QSize extra;
  QSize result;
  undefined8 in_stack_ffffffffffffff98;
  int w;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffc0;
  WizardPixmap which;
  QWizardPage *in_stack_ffffffffffffffc8;
  QLayout *in_stack_ffffffffffffffe0;
  
  which = (WizardPixmap)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWizard *)0x7bc25a);
  QLayout::totalSizeHint(in_stack_ffffffffffffffe0);
  QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
  w = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if ((this_00->wizStyle == MacStyle) && (this_00->current != -1)) {
    currentPage((QWizard *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    QWizardPage::pixmap(in_stack_ffffffffffffffc8,which);
    QPixmap::size();
    QPixmap::~QPixmap((QPixmap *)&stack0xffffffffffffffc8);
    QSize::setWidth((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),w);
    bVar2 = QSize::isNull((QSize *)this_00);
    if (!bVar2) {
      QSize::height((QSize *)0x7bc32d);
      QSize::setHeight((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),w);
      in_stack_ffffffffffffffa4 = QSize::width((QSize *)0x7bc343);
      iVar3 = QSize::height((QSize *)0x7bc351);
      if (iVar3 <= in_stack_ffffffffffffffa4) {
        QSize::width((QSize *)0x7bc365);
        QSize::setWidth((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),w);
      }
    }
  }
  QVar4 = QSize::expandedTo(in_RDI,(QSize *)CONCAT44(in_stack_ffffffffffffffa4,
                                                     in_stack_ffffffffffffffa0));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar4;
}

Assistant:

QSize QWizard::sizeHint() const
{
    Q_D(const QWizard);
    QSize result = d->mainLayout->totalSizeHint();
    QSize extra(500, 360);
    if (d->wizStyle == MacStyle && d->current != -1) {
        QSize pixmap(currentPage()->pixmap(BackgroundPixmap).size());
        extra.setWidth(616);
        if (!pixmap.isNull()) {
            extra.setHeight(pixmap.height());

            /*
                The width isn't always reliable as a size hint, as
                some wizard backgrounds just cover the leftmost area.
                Use a rule of thumb to determine if the width is
                reliable or not.
            */
            if (pixmap.width() >= pixmap.height())
                extra.setWidth(pixmap.width());
        }
    }
    return result.expandedTo(extra);
}